

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O2

void Bmcg_ManStop(Bmcg_Man_t *p)

{
  void **__ptr;
  void *__ptr_00;
  int i;
  int i_00;
  long lVar1;
  
  Gia_ManStopP(&p->pFrames);
  Gia_ManStopP(&p->pClean);
  for (i_00 = 0; i_00 < (p->vGia2Fr).nSize; i_00 = i_00 + 1) {
    __ptr_00 = Vec_PtrEntry(&p->vGia2Fr,i_00);
    if ((void *)0x2 < __ptr_00) {
      free(__ptr_00);
    }
  }
  __ptr = (p->vGia2Fr).pArray;
  if (__ptr != (void **)0x0) {
    free(__ptr);
    (p->vGia2Fr).pArray = (void **)0x0;
  }
  (p->vGia2Fr).nCap = 0;
  (p->vGia2Fr).nSize = 0;
  Vec_IntErase(&p->vFr2Sat);
  Vec_IntErase(&p->vCiMap);
  for (lVar1 = 0; lVar1 < p->pPars->nProcs; lVar1 = lVar1 + 1) {
    if (p->pSats[lVar1] != (bmcg_sat_solver *)0x0) {
      bmcg_sat_solver_stop(p->pSats[lVar1]);
    }
  }
  free(p);
  return;
}

Assistant:

void Bmcg_ManStop( Bmcg_Man_t * p )
{
    int i;
    Gia_ManStopP( &p->pFrames );
    Gia_ManStopP( &p->pClean );
    Vec_PtrFreeData( &p->vGia2Fr );
    Vec_PtrErase( &p->vGia2Fr );
    Vec_IntErase( &p->vFr2Sat );
    Vec_IntErase( &p->vCiMap );
    for ( i = 0; i < p->pPars->nProcs; i++ )
        if ( p->pSats[i] ) 
            bmcg_sat_solver_stop( p->pSats[i] );
    ABC_FREE( p );
}